

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O2

bool __thiscall Reducer::reduceFunctions(Reducer *this)

{
  Module *pMVar1;
  pointer puVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  ostream *poVar6;
  size_type sVar7;
  long lVar8;
  undefined7 extraout_var;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  size_t max;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar12;
  ulong uVar13;
  long lVar14;
  Name NVar15;
  _Vector_base<wasm::Name,_std::allocator<wasm::Name>_> local_c8;
  _Vector_base<wasm::Name,_std::allocator<wasm::Name>_> local_b0;
  undefined1 auStack_98 [8];
  value_type name;
  undefined1 auStack_78 [8];
  vector<wasm::Name,_std::allocator<wasm::Name>_> functionNames;
  ulong local_50;
  undefined1 auStack_48 [8];
  vector<wasm::Name,_std::allocator<wasm::Name>_> names;
  
  functionNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_78 = (undefined1  [8])0x0;
  functionNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pMVar1 = (this->module)._M_t.
           super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
           super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
  puVar2 = *(pointer *)
            ((long)&(pMVar1->functions).
                    super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            + 8);
  for (puVar12 = *(pointer *)
                  &(pMVar1->functions).
                   super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ._M_impl; puVar12 != puVar2; puVar12 = puVar12 + 1) {
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
              ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_78,
               (value_type *)
               (puVar12->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>);
  }
  if ((long)functionNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start - (long)auStack_78 == 0) {
    bVar3 = false;
  }
  else {
    max = (long)functionNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_start - (long)auStack_78 >> 4;
    sVar5 = deterministicRandom(this,max);
    poVar6 = std::operator<<((ostream *)&std::cerr,"|    try to remove functions (base: ");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    poVar6 = std::operator<<(poVar6,", decisionCounter: ");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    poVar6 = std::operator<<(poVar6,", numFuncs ");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::operator<<(poVar6,")\n");
    uVar13 = CONCAT71((int7)((ulong)puVar12 >> 8),1);
    uVar9 = 1;
    local_50 = 1;
    pcVar10 = (char *)0x0;
    while (pcVar10 < (char *)((long)functionNames.
                                    super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                                    _M_impl.super__Vector_impl_data._M_start - (long)auStack_78 >> 4
                             )) {
      uVar11 = (ulong)(pcVar10 + sVar5) % max;
      functionNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = (uint)uVar13;
      name.super_IString.str._M_str = pcVar10;
      if (((uVar13 & 1) == 0) &&
         (sVar7 = std::
                  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::count(&functionsWeTriedToRemove._M_h,
                          (key_type *)((long)auStack_78 + uVar11 * 0x10)), sVar7 == 1)) {
        iVar4 = this->factor / 5;
        if (iVar4 < 20000) {
          iVar4 = 19999;
        }
        bVar3 = shouldTryToReduce(this,(ulong)(iVar4 + 1));
        if (bVar3) goto LAB_00130809;
        uVar13 = 0;
      }
      else {
LAB_00130809:
        names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        auStack_48 = (undefined1  [8])0x0;
        names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        for (lVar14 = 0;
            ((ulong)((long)names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl
                           .super__Vector_impl_data._M_start - (long)auStack_48 >> 4) < uVar9 &&
            (uVar13 = lVar14 + uVar11,
            uVar13 < (ulong)((long)functionNames.
                                   super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                                   _M_impl.super__Vector_impl_data._M_start - (long)auStack_78 >> 4)
            )); lVar14 = lVar14 + 1) {
          auStack_98 = (undefined1  [8])
                       (((pointer)((long)auStack_78 + uVar13 * 0x10))->super_IString).str._M_len;
          name.super_IString.str._M_len =
               (size_t)(((pointer)((long)auStack_78 + uVar13 * 0x10))->super_IString).str._M_str;
          NVar15.super_IString.str._M_str = (char *)auStack_98;
          NVar15.super_IString.str._M_len =
               (size_t)(this->module)._M_t.
                       super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
                       super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
                       super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
          lVar8 = wasm::Module::getFunctionOrNull(NVar15);
          if (lVar8 != 0) {
            std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
                      ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_48,
                       (value_type *)auStack_98);
            std::__detail::
            _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::insert((_Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      *)&functionsWeTriedToRemove,(value_type *)auStack_98);
          }
        }
        if ((undefined1  [8])
            names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start == auStack_48) {
          uVar13 = (ulong)functionNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        }
        else {
          poVar6 = std::operator<<((ostream *)&std::cerr,"|     trying at i=");
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          poVar6 = std::operator<<(poVar6," of size ");
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          std::operator<<(poVar6,"\n");
          std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
                    ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&local_b0,
                     (vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_48);
          bVar3 = tryToEmptyFunctions(this,(vector<wasm::Name,_std::allocator<wasm::Name>_> *)
                                           &local_b0);
          uVar13 = CONCAT71((int7)((ulong)lVar14 >> 8),1);
          if (!bVar3) {
            std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
                      ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&local_c8,
                       (vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_48);
            bVar3 = tryToRemoveFunctions
                              (this,(vector<wasm::Name,_std::allocator<wasm::Name>_> *)&local_c8);
            uVar13 = CONCAT71(extraout_var,bVar3) & 0xffffffff;
            std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base(&local_c8);
          }
          std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base(&local_b0);
          if ((char)uVar13 == '\0') {
            bVar3 = uVar9 < 2;
            uVar9 = uVar9 >> 1;
            if (bVar3) {
              uVar9 = 1;
            }
            lVar14 = (long)(this->factor / 100);
          }
          else {
            noteReduction(this,(long)names.
                                     super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                                     _M_impl.super__Vector_impl_data._M_start - (long)auStack_48 >>
                               4);
            lVar14 = uVar9 - 1;
            uVar9 = uVar9 * 2;
            if ((ulong)(long)this->factor <= uVar9) {
              uVar9 = (long)this->factor;
            }
            if (local_50 < uVar9) {
              local_50 = uVar9;
            }
          }
          name.super_IString.str._M_str = name.super_IString.str._M_str + lVar14;
        }
        std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base
                  ((_Vector_base<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_48);
      }
      pcVar10 = name.super_IString.str._M_str + 1;
    }
    bVar3 = 2 < local_50;
  }
  std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base
            ((_Vector_base<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_78);
  return bVar3;
}

Assistant:

bool reduceFunctions() {
    // try to remove functions
    std::vector<Name> functionNames;
    for (auto& func : module->functions) {
      functionNames.push_back(func->name);
    }
    auto numFuncs = functionNames.size();
    if (numFuncs == 0) {
      return false;
    }
    size_t skip = 1;
    size_t maxSkip = 1;
    // If we just removed some functions in the previous iteration, keep trying
    // to remove more as this is one of the most efficient ways to reduce.
    bool justReduced = true;
    // Start from a new place each time.
    size_t base = deterministicRandom(numFuncs);
    std::cerr << "|    try to remove functions (base: " << base
              << ", decisionCounter: " << decisionCounter << ", numFuncs "
              << numFuncs << ")\n";
    for (size_t x = 0; x < functionNames.size(); x++) {
      size_t i = (base + x) % numFuncs;
      if (!justReduced &&
          functionsWeTriedToRemove.count(functionNames[i]) == 1 &&
          !shouldTryToReduce(std::max((factor / 5) + 1, 20000))) {
        continue;
      }
      std::vector<Name> names;
      for (size_t j = 0; names.size() < skip && i + j < functionNames.size();
           j++) {
        auto name = functionNames[i + j];
        if (module->getFunctionOrNull(name)) {
          names.push_back(name);
          functionsWeTriedToRemove.insert(name);
        }
      }
      if (names.size() == 0) {
        continue;
      }
      std::cerr << "|     trying at i=" << i << " of size " << names.size()
                << "\n";
      // Try to remove functions and/or empty them. Note that
      // tryToRemoveFunctions() will reload the module if it fails, which means
      // function names may change - for that reason, run it second.
      justReduced = tryToEmptyFunctions(names) || tryToRemoveFunctions(names);
      if (justReduced) {
        noteReduction(names.size());
        // Subtract 1 since the loop increments us anyhow by one: we want to
        // skip over the skipped functions, and not any more.
        x += skip - 1;
        skip = std::min(size_t(factor), 2 * skip);
        maxSkip = std::max(skip, maxSkip);
      } else {
        skip = std::max(skip / 2, size_t(1)); // or 1?
        x += factor / 100;
      }
    }
    // If maxSkip is 1 then we never reduced at all. If it is 2 then we did
    // manage to reduce individual functions, but all our attempts at
    // exponential growth failed. Only suggest doing a new iteration of this
    // function if we did in fact manage to grow, which indicated there are lots
    // of opportunities here, and it is worth focusing on this.
    return maxSkip > 2;
  }